

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UnicodeSet * __thiscall icu_63::UnicodeSet::add(UnicodeSet *this,UChar32 c)

{
  int iVar1;
  UChar32 *pUVar2;
  UBool UVar3;
  UChar32 c_00;
  UChar32 *srclimit_1;
  UChar32 *dst_1;
  UChar32 *src_1;
  UChar32 *pUStack_40;
  UErrorCode status_1;
  UChar32 *srclimit;
  UChar32 *src;
  UChar32 *dst;
  uint local_20;
  UErrorCode status;
  int32_t i;
  UChar32 c_local;
  UnicodeSet *this_local;
  
  status = c;
  _i = this;
  c_00 = pinCodePoint(&status);
  local_20 = findCodePoint(this,c_00);
  if ((((local_20 & 1) == 0) && (UVar3 = isFrozen(this), UVar3 == '\0')) &&
     (UVar3 = isBogus(this), UVar3 == '\0')) {
    if (status == this->list[(int)local_20] + ~U_ZERO_ERROR) {
      this->list[(int)local_20] = status;
      if (status == 0x10ffff) {
        dst._4_4_ = U_ZERO_ERROR;
        ensureCapacity(this,this->len + 1,(UErrorCode *)((long)&dst + 4));
        UVar3 = ::U_FAILURE(dst._4_4_);
        if (UVar3 != '\0') {
          return this;
        }
        iVar1 = this->len;
        this->len = iVar1 + 1;
        this->list[iVar1] = 0x110000;
      }
      if ((0 < (int)local_20) && (status == this->list[(int)(local_20 - 1)])) {
        srclimit = this->list + (int)local_20;
        pUStack_40 = this->list + this->len;
        src = srclimit + -1;
        while (srclimit = srclimit + 1, srclimit < pUStack_40) {
          *src = *srclimit;
          src = src + 1;
        }
        this->len = this->len + -2;
      }
    }
    else if (((int)local_20 < 1) || (status != this->list[(int)(local_20 - 1)])) {
      src_1._4_4_ = U_ZERO_ERROR;
      ensureCapacity(this,this->len + 2,(UErrorCode *)((long)&src_1 + 4));
      UVar3 = ::U_FAILURE(src_1._4_4_);
      if (UVar3 != '\0') {
        return this;
      }
      pUVar2 = this->list;
      srclimit_1 = this->list + this->len + 2;
      dst_1 = this->list + this->len;
      while (pUVar2 + (int)local_20 < dst_1) {
        srclimit_1[-1] = dst_1[-1];
        srclimit_1 = srclimit_1 + -1;
        dst_1 = dst_1 + -1;
      }
      this->list[(int)local_20] = status;
      this->list[(int)(local_20 + 1)] = status + U_ILLEGAL_ARGUMENT_ERROR;
      this->len = this->len + 2;
    }
    else {
      this->list[(int)(local_20 - 1)] = this->list[(int)(local_20 - 1)] + 1;
    }
    releasePattern(this);
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::add(UChar32 c) {
    // find smallest i such that c < list[i]
    // if odd, then it is IN the set
    // if even, then it is OUT of the set
    int32_t i = findCodePoint(pinCodePoint(c));

    // already in set?
    if ((i & 1) != 0  || isFrozen() || isBogus()) return *this;

    // HIGH is 0x110000
    // assert(list[len-1] == HIGH);

    // empty = [HIGH]
    // [start_0, limit_0, start_1, limit_1, HIGH]

    // [..., start_k-1, limit_k-1, start_k, limit_k, ..., HIGH]
    //                             ^
    //                             list[i]

    // i == 0 means c is before the first range

#ifdef DEBUG_US_ADD
    printf("Add of ");
    dump(c);
    printf(" found at %d", i);
    printf(": ");
    dump(list, len);
    printf(" => ");
#endif

    if (c == list[i]-1) {
        // c is before start of next range
        list[i] = c;
        // if we touched the HIGH mark, then add a new one
        if (c == (UNICODESET_HIGH - 1)) {
            UErrorCode status = U_ZERO_ERROR;
            ensureCapacity(len+1, status);
            if (U_FAILURE(status)) {
                // ensureCapacity will mark the object as Bogus if OOM failure happens.
                return *this;
            }
            list[len++] = UNICODESET_HIGH;
        }
        if (i > 0 && c == list[i-1]) {
            // collapse adjacent ranges

            // [..., start_k-1, c, c, limit_k, ..., HIGH]
            //                     ^
            //                     list[i]

            //for (int32_t k=i-1; k<len-2; ++k) {
            //    list[k] = list[k+2];
            //}
            UChar32* dst = list + i - 1;
            UChar32* src = dst + 2;
            UChar32* srclimit = list + len;
            while (src < srclimit) *(dst++) = *(src++);

            len -= 2;
        }
    }

    else if (i > 0 && c == list[i-1]) {
        // c is after end of prior range
        list[i-1]++;
        // no need to check for collapse here
    }

    else {
        // At this point we know the new char is not adjacent to
        // any existing ranges, and it is not 10FFFF.


        // [..., start_k-1, limit_k-1, start_k, limit_k, ..., HIGH]
        //                             ^
        //                             list[i]

        // [..., start_k-1, limit_k-1, c, c+1, start_k, limit_k, ..., HIGH]
        //                             ^
        //                             list[i]

        UErrorCode status = U_ZERO_ERROR;
        ensureCapacity(len+2, status);
        if (U_FAILURE(status)) {
            // ensureCapacity will mark the object as Bogus if OOM failure happens.
            return *this;
        }

        //for (int32_t k=len-1; k>=i; --k) {
        //    list[k+2] = list[k];
        //}
        UChar32* src = list + len;
        UChar32* dst = src + 2;
        UChar32* srclimit = list + i;
        while (src > srclimit) *(--dst) = *(--src);

        list[i] = c;
        list[i+1] = c+1;
        len += 2;
    }

#ifdef DEBUG_US_ADD
    dump(list, len);
    printf("\n");

    for (i=1; i<len; ++i) {
        if (list[i] <= list[i-1]) {
            // Corrupt array!
            printf("ERROR: list has been corrupted\n");
            exit(1);
        }
    }
#endif

    releasePattern();
    return *this;
}